

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O0

QString * Html::span(QString *__return_storage_ptr__,QString *text_,HtmlStyle *style)

{
  QString *pQVar1;
  QLatin1Char local_f7;
  QChar local_f6;
  QLatin1Char local_f3;
  QChar local_f2;
  QString local_f0;
  QString local_d8;
  QString local_c0;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_50;
  undefined1 local_38 [8];
  QString text;
  HtmlStyle *style_local;
  QString *text__local;
  
  text.d.size = (qsizetype)style;
  QString::QString((QString *)local_38,text_);
  QString::QString(&local_50,"<");
  QString::QString(&local_78,"&lt;");
  pQVar1 = (QString *)QString::replace((QString *)local_38,&local_50,(CaseSensitivity)&local_78);
  QString::QString(&local_90,">");
  QString::QString(&local_a8,"&gt;");
  QString::replace(pQVar1,&local_90,(CaseSensitivity)&local_a8);
  QString::~QString(&local_a8);
  QString::~QString(&local_90);
  QString::~QString(&local_78);
  QString::~QString(&local_50);
  QString::QString(&local_d8,"<span %1>%2</span>");
  HtmlStyle::toString(&local_f0,(HtmlStyle *)text.d.size);
  QLatin1Char::QLatin1Char(&local_f3,' ');
  QChar::QChar(&local_f2,local_f3);
  QString::arg(&local_c0,(int)&local_d8,(QChar *)&local_f0);
  QLatin1Char::QLatin1Char(&local_f7,' ');
  QChar::QChar(&local_f6,local_f7);
  QString::arg(__return_storage_ptr__,(int)&local_c0,(QChar *)local_38);
  QString::~QString(&local_c0);
  QString::~QString(&local_f0);
  QString::~QString(&local_d8);
  QString::~QString((QString *)local_38);
  return __return_storage_ptr__;
}

Assistant:

QString Html::span(const QString &text_, const HtmlStyle& style) {
    QString text = text_;
    text.replace("<","&lt;").replace(">","&gt;");
    return QString("<span %1>%2</span>").arg(style.toString()).arg(text);
}